

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_storage.cpp
# Opt level: O3

tuple<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
 __thiscall
libtorrent::aux::file_piece_range_exclusive(aux *this,file_storage *fs,file_index_t file)

{
  pointer pfVar1;
  int iVar2;
  peer_request pVar3;
  
  pVar3 = file_storage::map_file(fs,file,0,1);
  pfVar1 = (fs->m_files).
           super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
           super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(fs->m_files).
                          super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                          .
                          super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar1) >> 3) *
      -0x33333333 + -1 == file.m_val) {
    iVar2 = fs->m_num_pieces;
  }
  else {
    iVar2 = (int)((long)((*(ulong *)&pfVar1[file.m_val].field_0x8 & 0xffffffffffff) +
                         ((long)pVar3._0_8_ >> 0x20) +
                         (long)pVar3.piece.m_val.m_val * (long)fs->m_piece_length + 1) /
                 (long)fs->m_piece_length);
  }
  *(int *)this = iVar2;
  *(uint *)(this + 4) = (pVar3.piece.m_val.m_val + 1) - (uint)(pVar3._0_8_ >> 0x20 == 0);
  return (tuple<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          )(_Tuple_impl<0UL,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
            )this;
}

Assistant:

std::tuple<piece_index_t, piece_index_t>
	file_piece_range_exclusive(file_storage const& fs, file_index_t const file)
	{
		peer_request const range = fs.map_file(file, 0, 1);
		std::int64_t const file_size = fs.file_size(file);
		std::int64_t const piece_size = fs.piece_length();
		piece_index_t const begin_piece = range.start == 0 ? range.piece : piece_index_t(static_cast<int>(range.piece) + 1);
		// the last piece is potentially smaller than the other pieces, so the
		// generic logic doesn't really work. If this file is the last file, the
		// last piece doesn't overlap with any other file and it's entirely
		// contained within the last file.
		piece_index_t const end_piece = (file == file_index_t(fs.num_files() - 1))
			? piece_index_t(fs.num_pieces())
			: piece_index_t(int((static_cast<int>(range.piece) * piece_size + range.start + file_size + 1) / piece_size));
		return std::make_tuple(begin_piece, end_piece);
	}